

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_tlbiva(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  TCGv_ptr arg1;
  uint32_t uVar1;
  TCGv_i64 EA;
  TCGv_i64 t0;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  if ((ctx->pr & 1U) == 0) {
    EA = tcg_temp_new_i64(tcg_ctx_00);
    gen_addr_reg_index(ctx,EA);
    arg1 = tcg_ctx_00->cpu_env;
    uVar1 = rB(ctx->opcode);
    gen_helper_tlbiva(tcg_ctx_00,arg1,cpu_gpr[uVar1]);
    tcg_temp_free_i64(tcg_ctx_00,EA);
  }
  else {
    gen_priv_exception(ctx,1);
  }
  return;
}

Assistant:

static void gen_tlbiva(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;

    CHK_SV;
    t0 = tcg_temp_new(tcg_ctx);
    gen_addr_reg_index(ctx, t0);
    gen_helper_tlbiva(tcg_ctx, tcg_ctx->cpu_env, cpu_gpr[rB(ctx->opcode)]);
    tcg_temp_free(tcg_ctx, t0);
}